

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::TestSpec::Pattern> * __thiscall
Catch::Ptr<Catch::TestSpec::Pattern>::operator=(Ptr<Catch::TestSpec::Pattern> *this,Pattern *p)

{
  Ptr<Catch::TestSpec::Pattern> local_20;
  Ptr<Catch::TestSpec::Pattern> temp;
  Pattern *p_local;
  Ptr<Catch::TestSpec::Pattern> *this_local;
  
  temp.m_p = p;
  Ptr(&local_20,p);
  swap(this,&local_20);
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }